

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::ExceptionTranslatorRegistry::~ExceptionTranslatorRegistry(ExceptionTranslatorRegistry *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  (this->super_IExceptionTranslatorRegistry)._vptr_IExceptionTranslatorRegistry =
       (_func_int **)&PTR__ExceptionTranslatorRegistry_001b0480;
  ppIVar2 = (this->m_translators).
            super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->m_translators).
            super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar2 != ppIVar1) {
    do {
      if (*ppIVar2 != (IExceptionTranslator *)0x0) {
        (*(*ppIVar2)->_vptr_IExceptionTranslator[1])();
      }
      ppIVar2 = ppIVar2 + 1;
    } while (ppIVar2 != ppIVar1);
    ppIVar2 = (this->m_translators).
              super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppIVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(ppIVar2);
  return;
}

Assistant:

~ExceptionTranslatorRegistry() {
            deleteAll( m_translators );
        }